

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx_locks.c
# Opt level: O3

void * rec_val(pfx_table *pfxt)

{
  __pid_t _Var1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t asn;
  long in_FS_OFFSET;
  pfxv_state res;
  pfxv_state local_64 [2];
  lrtr_ip_addr local_5c;
  undefined2 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1 = getpid();
  puts("validating..");
  if (min_i <= max_i) {
    asn = _Var1 % 2 + 1;
    uVar3 = max_i;
    do {
      local_48 = 0x2020;
      local_5c.ver = LRTR_IPV4;
      uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      local_5c.u.addr6.addr[0] = uVar4;
      pfx_table_validate(pfxt,_Var1 % 2,&local_5c,' ',local_64);
      pfx_table_validate(pfxt,asn,&local_5c,(uint8_t)local_48,local_64);
      local_48 = 0x8080;
      local_5c.ver = LRTR_IPV6;
      local_5c.u.addr6.addr[1] = min_i - 1;
      local_5c.u.addr6.addr[0] = uVar4 - 1;
      pfx_table_validate(pfxt,asn,&local_5c,0x80,local_64);
      iVar2 = rand();
      usleep(iVar2 / 0x6666666);
      uVar3 = uVar3 - 1;
    } while (min_i <= uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (void *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static void *rec_val(struct pfx_table *pfxt)
{
	const int tid = getpid();
	struct pfx_record rec;
	enum pfxv_state res;

	rec.min_len = 32;
	rec.max_len = 32;
	rec.prefix.ver = LRTR_IPV4;
	rec.prefix.u.addr4.addr = 0;
	printf("validating..\n");
	for (uint32_t i = max_i; i >= min_i; i--) {
		rec.min_len = 32;
		rec.max_len = 32;
		rec.prefix.ver = LRTR_IPV4;
		rec.prefix.u.addr4.addr = htonl(i);
		pfx_table_validate(pfxt, (tid % 2), &rec.prefix, rec.min_len, &res);
		pfx_table_validate(pfxt, (tid % 2) + 1, &rec.prefix, rec.min_len, &res);

		rec.min_len = 128;
		rec.max_len = 128;
		rec.prefix.ver = LRTR_IPV6;
		rec.prefix.u.addr6.addr[1] = min_i + 0xFFFFFFFF;
		rec.prefix.u.addr6.addr[0] = htonl(i) + 0xFFFFFFFF;

		pfx_table_validate(pfxt, (tid % 2) + 1, &rec.prefix, rec.min_len, &res);
		usleep(rand() / (RAND_MAX / 20));
	}

	return NULL;
}